

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall calculator::SyntaxError::~SyntaxError(SyntaxError *this)

{
  SyntaxError *this_local;
  
  ~SyntaxError(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

SyntaxError(const std::string& error = "") {
        error_msg = "Error: " + error;
    }